

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLayers.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeInputLayers(ConvertLayerParameters layerParameters)

{
  Rep *pRVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  ulong uVar5;
  ostream *poVar6;
  Type *pTVar7;
  mapped_type *this;
  runtime_error *prVar8;
  long lVar9;
  long *plVar10;
  InputParameter *pIVar11;
  long *__x;
  vector<long,_std::allocator<long>_> dims;
  allocator local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  bVar2 = std::operator==((pTVar3->type_).ptr_,"Input");
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,"WARNING: Skipping Data Layer \'");
    poVar6 = std::operator<<(poVar6,(string *)(pTVar3->name_).ptr_);
    poVar6 = std::operator<<(poVar6,"\' of type \'");
    poVar6 = std::operator<<(poVar6,(string *)(pTVar3->type_).ptr_);
    poVar6 = std::operator<<(poVar6,"\'. It is recommended to use Input layer for deployment.");
    std::endl<char,std::char_traits<char>>(poVar6);
    return;
  }
  pIVar11 = pTVar3->input_param_;
  if (pIVar11 == (InputParameter *)0x0) {
    pIVar11 = (InputParameter *)&caffe::_InputParameter_default_instance_;
  }
  if ((pIVar11->shape_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<(local_1a8,"Invalid caffe model: Input layer \'");
    poVar6 = std::operator<<(poVar6,(string *)(pTVar3->name_).ptr_);
    poVar6 = std::operator<<(poVar6,"\' does not specify the shape parameter.");
    std::endl<char,std::char_traits<char>>(poVar6);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)local_1d8);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                     (&(pIVar11->shape_).super_RepeatedPtrFieldBase,0);
  dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  lVar9 = (long)(pTVar4->dim_).current_size_;
  if (lVar9 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<(local_1a8,"Invalid caffe model: Input layer \'");
    poVar6 = std::operator<<(poVar6,(string *)(pTVar3->name_).ptr_);
    poVar6 = std::operator<<(poVar6,"\' does not specify dimensions.");
    std::endl<char,std::char_traits<char>>(poVar6);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)local_1d8);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pRVar1 = (pTVar4->dim_).rep_;
  __x = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    __x = (long *)0x0;
  }
  plVar10 = pRVar1->elements + lVar9;
  if (pRVar1 == (Rep *)0x0) {
    plVar10 = (long *)0x0;
  }
  while( true ) {
    if (__x == plVar10) {
      uVar5 = (long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar5 == 0x10) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "Ignoring batch/seq size and retaining only the last dimension for conversion. "
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
        std::vector<long,_std::allocator<long>_>::erase
                  (&dims,(const_iterator)
                         dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   (const_iterator)
                   (dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1));
        uVar5 = (long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
      }
      if (0x18 < uVar5) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "Ignoring batch size and retaining only the trailing 3 dimensions for conversion. "
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
        std::vector<long,_std::allocator<long>_>::erase
                  (&dims,(const_iterator)
                         dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   (const_iterator)
                   (dims.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + -3));
      }
      if ((pTVar3->top_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        std::__cxx11::string::string
                  ((string *)&ss,"Caffe layer does not have a top blob ",local_1d8);
        errorInCaffeProto((string *)&ss,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
        std::__cxx11::string::~string((string *)&ss);
      }
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(pTVar3->top_).super_RepeatedPtrFieldBase,0);
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
             ::operator[](layerParameters.mapBlobNameToDimensions,pTVar7);
      std::vector<long,_std::allocator<long>_>::operator=(this,&dims);
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(pTVar3->top_).super_RepeatedPtrFieldBase,0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)layerParameters.caffeNetworkInputNames,pTVar7);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&dims.super__Vector_base<long,_std::allocator<long>_>);
      return;
    }
    if (*__x < 0) break;
    std::vector<long,_std::allocator<long>_>::push_back(&dims,__x);
    __x = __x + 1;
  }
  __assert_fail("dim >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InputLayers.cpp"
                ,0x2f,
                "void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::vector<int64_t> >& mapBlobNameToDimensions = layerParameters.mapBlobNameToDimensions;
    std::set<std::string>& caffeNetworkInputNames = layerParameters.caffeNetworkInputNames;
    
    /*
     Mapping from Caffe Input Layer dimensions to CoreML Specification input dimensions:
     1-D (C) ----> (C)
     2-D : (Batch/Seq,C) ----> (C) [last dimension retained]
     >=3-D (...,C,H,W) ----> (C,H,W) [last 3 dimensions retained]
     */
    
    if (caffeLayer.type() == "Input"){
        if (caffeLayer.input_param().shape_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify the shape parameter." << std::endl;
            throw std::runtime_error(ss.str());
        }
        const ::caffe::BlobShape& shape = caffeLayer.input_param().shape(0);
        std::vector<int64_t> dims;
        if (shape.dim_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify dimensions." << std::endl;
            throw std::runtime_error(ss.str());
        }
        for (const auto& dim: shape.dim()) {
            assert(dim >= 0);
            dims.push_back(dim);
        }
        if (dims.size() == 2) {
            std::cout<<"Ignoring batch/seq size and retaining only the last dimension for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-1);
        }
        if (dims.size() > 3) {
            std::cout<<"Ignoring batch size and retaining only the trailing 3 dimensions for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-3);
        }
        
        
        if (caffeLayer.top_size() == 0) {
            CoreMLConverter::errorInCaffeProto("Caffe layer does not have a top blob ",caffeLayer.name(),caffeLayer.type());
        }
        mapBlobNameToDimensions[caffeLayer.top(0)] = dims;
        caffeNetworkInputNames.insert(caffeLayer.top(0));
    } else {
        std::cout<<"WARNING: Skipping Data Layer '"<< caffeLayer.name() << "' of type '" << caffeLayer.type() <<"'. It is recommended to use Input layer for deployment."
                <<std::endl;
    }
}